

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.c
# Opt level: O1

OPJ_BOOL opj_sparse_array_int32_read_or_write
                   (opj_sparse_array_int32_t *sa,OPJ_UINT32 x0,OPJ_UINT32 y0,OPJ_UINT32 x1,
                   OPJ_UINT32 y1,OPJ_INT32 *buf,OPJ_UINT32 buf_col_stride,OPJ_UINT32 buf_line_stride
                   ,OPJ_BOOL forgiving,OPJ_BOOL is_read_op)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  ulong uVar5;
  OPJ_INT32 *pOVar6;
  OPJ_INT32 *pOVar7;
  long lVar8;
  ulong uVar9;
  OPJ_UINT32 OVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  OPJ_UINT32 OVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint local_94;
  
  if ((((x1 <= sa->width) && (x0 < x1)) && (x0 < sa->width)) &&
     ((y1 <= sa->height && y0 < y1) && y0 < sa->height)) {
    uVar1 = sa->block_width;
    uVar16 = (ulong)uVar1;
    local_94 = y0 / sa->block_height;
    uVar5 = (ulong)buf_line_stride;
    OVar18 = y0;
    do {
      uVar15 = sa->block_height;
      if (OVar18 - y0 == 0) {
        uVar15 = uVar15 - y0 % uVar15;
      }
      uVar17 = y1 - OVar18;
      if (uVar15 < y1 - OVar18) {
        uVar17 = uVar15;
      }
      if (x0 < x1) {
        lVar11 = (sa->block_height - uVar15) * uVar16;
        lVar8 = (OVar18 - y0) * uVar5;
        uVar15 = x0 / uVar1;
        OVar10 = x0;
        do {
          uVar19 = OVar10 - x0;
          uVar20 = uVar1;
          if (uVar19 == 0) {
            uVar20 = uVar1 - x0 % uVar1;
          }
          uVar13 = uVar1 - uVar20;
          uVar2 = x1 - OVar10;
          if (uVar20 < x1 - OVar10) {
            uVar2 = uVar20;
          }
          uVar21 = (ulong)uVar2;
          pOVar6 = sa->data_blocks[sa->block_count_hor * local_94 + uVar15];
          if (is_read_op == 0) {
            if (pOVar6 == (OPJ_INT32 *)0x0) {
              pOVar6 = (OPJ_INT32 *)opj_calloc(1,(ulong)(sa->block_height * sa->block_width) << 2);
              if (pOVar6 == (OPJ_INT32 *)0x0) {
                return 0;
              }
              sa->data_blocks[sa->block_count_hor * local_94 + uVar15] = pOVar6;
            }
            if (buf_col_stride == 1) {
              pOVar6 = pOVar6 + lVar11 + (ulong)uVar13;
              pOVar7 = buf + lVar8 + (ulong)uVar19;
              uVar20 = uVar17;
              if (uVar2 == 4) {
                for (; uVar20 != 0; uVar20 = uVar20 - 1) {
                  uVar4 = *(undefined8 *)(pOVar7 + 2);
                  *(undefined8 *)pOVar6 = *(undefined8 *)pOVar7;
                  *(undefined8 *)(pOVar6 + 2) = uVar4;
                  pOVar7 = pOVar7 + uVar5;
                  pOVar6 = pOVar6 + uVar16;
                }
              }
              else if (uVar17 != 0) {
                do {
                  memcpy(pOVar6,pOVar7,uVar21 << 2);
                  pOVar7 = pOVar7 + uVar5;
                  pOVar6 = pOVar6 + uVar16;
                  uVar20 = uVar20 - 1;
                } while (uVar20 != 0);
              }
            }
            else {
              pOVar6 = pOVar6 + lVar11 + (ulong)uVar13;
              pOVar7 = buf + lVar8 + (ulong)(uVar19 * buf_col_stride);
              uVar20 = uVar17;
              if (uVar2 == 1) {
                for (; uVar20 != 0; uVar20 = uVar20 - 1) {
                  *pOVar6 = *pOVar7;
                  pOVar7 = pOVar7 + uVar5;
                  pOVar6 = pOVar6 + uVar16;
                }
              }
              else if ((buf_col_stride == 8) && (7 < uVar2)) {
                if (uVar17 != 0) {
                  uVar20 = 0;
                  do {
                    uVar9 = 0;
                    if ((ulong)(uVar2 & 0xfffffffc) != 0) {
                      uVar19 = 0;
                      uVar9 = 0;
                      do {
                        pOVar6[uVar9] = pOVar7[uVar19];
                        pOVar6[uVar9 + 1] = pOVar7[uVar19 + 8 & 0xffffffe8];
                        pOVar6[uVar9 + 2] = pOVar7[uVar19 + 0x10];
                        pOVar6[uVar9 + 3] = pOVar7[uVar19 + 0x18];
                        uVar9 = uVar9 + 4;
                        uVar19 = uVar19 + 0x20;
                      } while (uVar9 < (uVar2 & 0xfffffffc));
                    }
                    if ((uint)uVar9 < uVar2) {
                      uVar9 = uVar9 & 0xffffffff;
                      uVar14 = uVar9 * 8;
                      do {
                        pOVar6[uVar9] = pOVar7[uVar14 & 0xffffffff];
                        uVar9 = uVar9 + 1;
                        uVar14 = uVar14 + 8;
                      } while (uVar21 != uVar9);
                    }
                    pOVar7 = pOVar7 + uVar5;
                    uVar20 = uVar20 + 1;
                    pOVar6 = pOVar6 + uVar16;
                  } while (uVar20 != uVar17);
                }
              }
              else if (uVar17 != 0) {
                uVar20 = 0;
                do {
                  if (uVar2 != 0) {
                    uVar19 = 0;
                    uVar9 = 0;
                    do {
                      pOVar6[uVar9] = pOVar7[uVar19];
                      uVar9 = uVar9 + 1;
                      uVar19 = uVar19 + buf_col_stride;
                    } while (uVar21 != uVar9);
                  }
                  pOVar7 = pOVar7 + uVar5;
                  uVar20 = uVar20 + 1;
                  pOVar6 = pOVar6 + uVar16;
                } while (uVar20 != uVar17);
              }
            }
          }
          else if (pOVar6 == (OPJ_INT32 *)0x0) {
            if (buf_col_stride == 1) {
              if (uVar17 != 0) {
                pOVar6 = buf + lVar8 + (ulong)uVar19;
                uVar20 = uVar17;
                do {
                  memset(pOVar6,0,uVar21 << 2);
                  pOVar6 = pOVar6 + uVar5;
                  uVar20 = uVar20 - 1;
                } while (uVar20 != 0);
              }
            }
            else if (uVar17 != 0) {
              pOVar6 = buf + lVar8 + (ulong)(uVar19 * buf_col_stride);
              uVar20 = 0;
              do {
                if (uVar2 != 0) {
                  uVar19 = 0;
                  uVar9 = uVar21;
                  do {
                    pOVar6[uVar19] = 0;
                    uVar19 = uVar19 + buf_col_stride;
                    uVar9 = uVar9 - 1;
                  } while (uVar9 != 0);
                }
                pOVar6 = pOVar6 + uVar5;
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar17);
            }
          }
          else {
            pOVar6 = pOVar6 + lVar11 + (ulong)uVar13;
            if (buf_col_stride == 1) {
              pOVar7 = buf + lVar8 + (ulong)uVar19;
              uVar20 = uVar17;
              if (uVar2 == 4) {
                for (; uVar20 != 0; uVar20 = uVar20 - 1) {
                  uVar4 = *(undefined8 *)(pOVar6 + 2);
                  *(undefined8 *)pOVar7 = *(undefined8 *)pOVar6;
                  *(undefined8 *)(pOVar7 + 2) = uVar4;
                  pOVar7 = pOVar7 + uVar5;
                  pOVar6 = pOVar6 + uVar16;
                }
              }
              else if (uVar17 != 0) {
                do {
                  memcpy(pOVar7,pOVar6,uVar21 << 2);
                  pOVar7 = pOVar7 + uVar5;
                  pOVar6 = pOVar6 + uVar16;
                  uVar20 = uVar20 - 1;
                } while (uVar20 != 0);
              }
            }
            else {
              pOVar7 = buf + lVar8 + (ulong)(uVar19 * buf_col_stride);
              uVar20 = uVar17;
              if (uVar2 == 1) {
                for (; uVar20 != 0; uVar20 = uVar20 - 1) {
                  *pOVar7 = *pOVar6;
                  pOVar7 = pOVar7 + uVar5;
                  pOVar6 = pOVar6 + uVar16;
                }
              }
              else if (uVar17 == 1 && buf_col_stride == 2) {
                if ((uVar2 & 0xfffffffc) == 0) {
                  uVar9 = 0;
                }
                else {
                  uVar14 = 4;
                  uVar9 = 0;
                  do {
                    iVar3 = (int)uVar14;
                    pOVar7[iVar3 - 4U & 0xfffffff8] = *(OPJ_INT32 *)((long)pOVar6 + uVar14 * 2 + -8)
                    ;
                    pOVar7[iVar3 - 2U & 0xfffffffa] = *(OPJ_INT32 *)((long)pOVar6 + uVar14 * 2 + -4)
                    ;
                    pOVar7[uVar14 & 0xffffffff] = *(OPJ_INT32 *)((long)pOVar6 + uVar14 * 2);
                    pOVar7[iVar3 + 2] = *(OPJ_INT32 *)((long)pOVar6 + uVar14 * 2 + 4);
                    uVar9 = uVar9 + 4;
                    uVar14 = uVar14 + 8;
                  } while (uVar9 < (uVar2 & 0xfffffffc));
                }
                if ((uint)uVar9 < uVar2) {
                  lVar12 = uVar21 - (uVar9 & 0xffffffff);
                  uVar21 = (uVar9 & 0xffffffff) * 2;
                  do {
                    pOVar7[uVar21 & 0xffffffff] = *(OPJ_INT32 *)((long)pOVar6 + uVar21 * 2);
                    uVar21 = uVar21 + 2;
                    lVar12 = lVar12 + -1;
                  } while (lVar12 != 0);
                }
              }
              else if ((buf_col_stride == 8) && (7 < uVar2)) {
                if (uVar17 != 0) {
                  uVar20 = 0;
                  do {
                    uVar9 = 0;
                    if ((ulong)(uVar2 & 0xfffffffc) != 0) {
                      uVar19 = 0;
                      uVar9 = 0;
                      do {
                        pOVar7[uVar19] = pOVar6[uVar9];
                        pOVar7[uVar19 + 8 & 0xffffffe8] = pOVar6[uVar9 + 1];
                        pOVar7[uVar19 + 0x10] = pOVar6[uVar9 + 2];
                        pOVar7[uVar19 + 0x18] = pOVar6[uVar9 + 3];
                        uVar9 = uVar9 + 4;
                        uVar19 = uVar19 + 0x20;
                      } while (uVar9 < (uVar2 & 0xfffffffc));
                    }
                    if ((uint)uVar9 < uVar2) {
                      uVar9 = uVar9 & 0xffffffff;
                      uVar14 = uVar9 * 8;
                      do {
                        pOVar7[uVar14 & 0xffffffff] = pOVar6[uVar9];
                        uVar9 = uVar9 + 1;
                        uVar14 = uVar14 + 8;
                      } while (uVar21 != uVar9);
                    }
                    pOVar7 = pOVar7 + uVar5;
                    uVar20 = uVar20 + 1;
                    pOVar6 = pOVar6 + uVar16;
                  } while (uVar20 != uVar17);
                }
              }
              else if (uVar17 != 0) {
                uVar20 = 0;
                do {
                  if (uVar2 != 0) {
                    uVar19 = 0;
                    uVar9 = 0;
                    do {
                      pOVar7[uVar19] = pOVar6[uVar9];
                      uVar9 = uVar9 + 1;
                      uVar19 = uVar19 + buf_col_stride;
                    } while (uVar21 != uVar9);
                  }
                  pOVar7 = pOVar7 + uVar5;
                  uVar20 = uVar20 + 1;
                  pOVar6 = pOVar6 + uVar16;
                } while (uVar20 != uVar17);
              }
            }
          }
          uVar15 = uVar15 + 1;
          OVar10 = OVar10 + uVar2;
        } while (OVar10 < x1);
      }
      local_94 = local_94 + 1;
      OVar18 = OVar18 + uVar17;
    } while (OVar18 < y1);
    forgiving = 1;
  }
  return forgiving;
}

Assistant:

static OPJ_BOOL opj_sparse_array_int32_read_or_write(
    const opj_sparse_array_int32_t* sa,
    OPJ_UINT32 x0,
    OPJ_UINT32 y0,
    OPJ_UINT32 x1,
    OPJ_UINT32 y1,
    OPJ_INT32* buf,
    OPJ_UINT32 buf_col_stride,
    OPJ_UINT32 buf_line_stride,
    OPJ_BOOL forgiving,
    OPJ_BOOL is_read_op)
{
    OPJ_UINT32 y, block_y;
    OPJ_UINT32 y_incr = 0;
    const OPJ_UINT32 block_width = sa->block_width;

    if (!opj_sparse_array_is_region_valid(sa, x0, y0, x1, y1)) {
        return forgiving;
    }

    block_y = y0 / sa->block_height;
    for (y = y0; y < y1; block_y ++, y += y_incr) {
        OPJ_UINT32 x, block_x;
        OPJ_UINT32 x_incr = 0;
        OPJ_UINT32 block_y_offset;
        y_incr = (y == y0) ? sa->block_height - (y0 % sa->block_height) :
                 sa->block_height;
        block_y_offset = sa->block_height - y_incr;
        y_incr = opj_uint_min(y_incr, y1 - y);
        block_x = x0 / block_width;
        for (x = x0; x < x1; block_x ++, x += x_incr) {
            OPJ_UINT32 j;
            OPJ_UINT32 block_x_offset;
            OPJ_INT32* src_block;
            x_incr = (x == x0) ? block_width - (x0 % block_width) : block_width;
            block_x_offset = block_width - x_incr;
            x_incr = opj_uint_min(x_incr, x1 - x);
            src_block = sa->data_blocks[block_y * sa->block_count_hor + block_x];
            if (is_read_op) {
                if (src_block == NULL) {
                    if (buf_col_stride == 1) {
                        OPJ_INT32* dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride +
                                              (x - x0) * buf_col_stride;
                        for (j = 0; j < y_incr; j++) {
                            memset(dest_ptr, 0, sizeof(OPJ_INT32) * x_incr);
                            dest_ptr += buf_line_stride;
                        }
                    } else {
                        OPJ_INT32* dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride +
                                              (x - x0) * buf_col_stride;
                        for (j = 0; j < y_incr; j++) {
                            OPJ_UINT32 k;
                            for (k = 0; k < x_incr; k++) {
                                dest_ptr[k * buf_col_stride] = 0;
                            }
                            dest_ptr += buf_line_stride;
                        }
                    }
                } else {
                    const OPJ_INT32* OPJ_RESTRICT src_ptr = src_block + block_y_offset *
                                                            (OPJ_SIZE_T)block_width + block_x_offset;
                    if (buf_col_stride == 1) {
                        OPJ_INT32* OPJ_RESTRICT dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride
                                                           +
                                                           (x - x0) * buf_col_stride;
                        if (x_incr == 4) {
                            /* Same code as general branch, but the compiler */
                            /* can have an efficient memcpy() */
                            (void)(x_incr); /* trick to silent cppcheck duplicateBranch warning */
                            for (j = 0; j < y_incr; j++) {
                                memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        } else {
                            for (j = 0; j < y_incr; j++) {
                                memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        }
                    } else {
                        OPJ_INT32* OPJ_RESTRICT dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride
                                                           +
                                                           (x - x0) * buf_col_stride;
                        if (x_incr == 1) {
                            for (j = 0; j < y_incr; j++) {
                                *dest_ptr = *src_ptr;
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        } else if (y_incr == 1 && buf_col_stride == 2) {
                            OPJ_UINT32 k;
                            for (k = 0; k < (x_incr & ~3U); k += 4) {
                                dest_ptr[k * buf_col_stride] = src_ptr[k];
                                dest_ptr[(k + 1) * buf_col_stride] = src_ptr[k + 1];
                                dest_ptr[(k + 2) * buf_col_stride] = src_ptr[k + 2];
                                dest_ptr[(k + 3) * buf_col_stride] = src_ptr[k + 3];
                            }
                            for (; k < x_incr; k++) {
                                dest_ptr[k * buf_col_stride] = src_ptr[k];
                            }
                        } else if (x_incr >= 8 && buf_col_stride == 8) {
                            for (j = 0; j < y_incr; j++) {
                                OPJ_UINT32 k;
                                for (k = 0; k < (x_incr & ~3U); k += 4) {
                                    dest_ptr[k * buf_col_stride] = src_ptr[k];
                                    dest_ptr[(k + 1) * buf_col_stride] = src_ptr[k + 1];
                                    dest_ptr[(k + 2) * buf_col_stride] = src_ptr[k + 2];
                                    dest_ptr[(k + 3) * buf_col_stride] = src_ptr[k + 3];
                                }
                                for (; k < x_incr; k++) {
                                    dest_ptr[k * buf_col_stride] = src_ptr[k];
                                }
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        } else {
                            /* General case */
                            for (j = 0; j < y_incr; j++) {
                                OPJ_UINT32 k;
                                for (k = 0; k < x_incr; k++) {
                                    dest_ptr[k * buf_col_stride] = src_ptr[k];
                                }
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        }
                    }
                }
            } else {
                if (src_block == NULL) {
                    src_block = (OPJ_INT32*) opj_calloc(1,
                                                        sa->block_width * sa->block_height * sizeof(OPJ_INT32));
                    if (src_block == NULL) {
                        return OPJ_FALSE;
                    }
                    sa->data_blocks[block_y * sa->block_count_hor + block_x] = src_block;
                }

                if (buf_col_stride == 1) {
                    OPJ_INT32* OPJ_RESTRICT dest_ptr = src_block + block_y_offset *
                                                       (OPJ_SIZE_T)block_width + block_x_offset;
                    const OPJ_INT32* OPJ_RESTRICT src_ptr = buf + (y - y0) *
                                                            (OPJ_SIZE_T)buf_line_stride + (x - x0) * buf_col_stride;
                    if (x_incr == 4) {
                        /* Same code as general branch, but the compiler */
                        /* can have an efficient memcpy() */
                        (void)(x_incr); /* trick to silent cppcheck duplicateBranch warning */
                        for (j = 0; j < y_incr; j++) {
                            memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                            dest_ptr += block_width;
                            src_ptr += buf_line_stride;
                        }
                    } else {
                        for (j = 0; j < y_incr; j++) {
                            memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                            dest_ptr += block_width;
                            src_ptr += buf_line_stride;
                        }
                    }
                } else {
                    OPJ_INT32* OPJ_RESTRICT dest_ptr = src_block + block_y_offset *
                                                       (OPJ_SIZE_T)block_width + block_x_offset;
                    const OPJ_INT32* OPJ_RESTRICT src_ptr = buf + (y - y0) *
                                                            (OPJ_SIZE_T)buf_line_stride + (x - x0) * buf_col_stride;
                    if (x_incr == 1) {
                        for (j = 0; j < y_incr; j++) {
                            *dest_ptr = *src_ptr;
                            src_ptr += buf_line_stride;
                            dest_ptr += block_width;
                        }
                    } else if (x_incr >= 8 && buf_col_stride == 8) {
                        for (j = 0; j < y_incr; j++) {
                            OPJ_UINT32 k;
                            for (k = 0; k < (x_incr & ~3U); k += 4) {
                                dest_ptr[k] = src_ptr[k * buf_col_stride];
                                dest_ptr[k + 1] = src_ptr[(k + 1) * buf_col_stride];
                                dest_ptr[k + 2] = src_ptr[(k + 2) * buf_col_stride];
                                dest_ptr[k + 3] = src_ptr[(k + 3) * buf_col_stride];
                            }
                            for (; k < x_incr; k++) {
                                dest_ptr[k] = src_ptr[k * buf_col_stride];
                            }
                            src_ptr += buf_line_stride;
                            dest_ptr += block_width;
                        }
                    } else {
                        /* General case */
                        for (j = 0; j < y_incr; j++) {
                            OPJ_UINT32 k;
                            for (k = 0; k < x_incr; k++) {
                                dest_ptr[k] = src_ptr[k * buf_col_stride];
                            }
                            src_ptr += buf_line_stride;
                            dest_ptr += block_width;
                        }
                    }
                }
            }
        }
    }

    return OPJ_TRUE;
}